

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::greedy_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  vector<lzham::lzcompressor::lzpriced_decision> *decisions;
  uint *puVar1;
  uint uVar2;
  state *cur_state;
  lzdecision *plVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint ofs;
  uint max_match_len;
  lzpriced_decision *lzdec;
  uint uVar7;
  
  (parse_state->super_raw_parse_thread_state).m_failed = true;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = false;
  ofs = (parse_state->super_raw_parse_thread_state).m_start_ofs;
  uVar2 = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  cur_state = (parse_state->super_raw_parse_thread_state).m_pState;
  decisions = &(parse_state->super_raw_parse_thread_state).m_temp_decisions;
  cVar4 = lzham::elemental_vector::increase_capacity
                    ((uint)decisions,true,1,(_func_void_void_ptr_void_ptr_uint *)0x18,true);
  if (cVar4 != '\0') {
    if ((parse_state->super_raw_parse_thread_state).m_best_decisions.m_size != 0) {
      (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size = 0;
    }
    uVar7 = 0;
    do {
      max_match_len = uVar2 - uVar7;
      if (uVar2 < uVar7 || max_match_len == 0) {
        (parse_state->super_raw_parse_thread_state).m_greedy_parse_total_bytes_coded = uVar7;
        (parse_state->super_raw_parse_thread_state).m_failed = false;
        (parse_state->super_raw_parse_thread_state).m_bytes_actually_parsed =
             (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
        return true;
      }
      if (0xffff < max_match_len) {
        max_match_len = 0x10000;
      }
      uVar5 = enumerate_lz_decisions(this,ofs,cur_state,decisions,1,max_match_len);
      if ((int)uVar5 < 0) {
        return false;
      }
      lzdec = (parse_state->super_raw_parse_thread_state).m_temp_decisions.m_p + uVar5;
      uVar5 = (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size;
      if ((parse_state->super_raw_parse_thread_state).m_best_decisions.m_capacity <= uVar5) {
        cVar4 = lzham::elemental_vector::increase_capacity
                          ((int)parse_state + 0x156710,(bool)((char)uVar5 + '\x01'),1,
                           (_func_void_void_ptr_void_ptr_uint *)0xc,true);
        if (cVar4 == '\0') {
          return false;
        }
        uVar5 = (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size;
      }
      plVar3 = (parse_state->super_raw_parse_thread_state).m_best_decisions.m_p;
      plVar3[uVar5].m_dist = (lzdec->super_lzdecision).m_dist;
      iVar6 = (lzdec->super_lzdecision).m_len;
      plVar3 = plVar3 + uVar5;
      plVar3->m_pos = (lzdec->super_lzdecision).m_pos;
      plVar3->m_len = iVar6;
      puVar1 = &(parse_state->super_raw_parse_thread_state).m_best_decisions.m_size;
      *puVar1 = *puVar1 + 1;
      state_base::partial_advance(&cur_state->super_state_base,&lzdec->super_lzdecision);
      iVar6 = (lzdec->super_lzdecision).m_len;
      iVar6 = iVar6 + (uint)(iVar6 == 0);
      ofs = ofs + iVar6;
      uVar7 = uVar7 + iVar6;
    } while ((parse_state->super_raw_parse_thread_state).m_best_decisions.m_size <
             (parse_state->super_raw_parse_thread_state).m_max_greedy_decisions);
    (parse_state->super_raw_parse_thread_state).m_greedy_parse_total_bytes_coded = uVar7;
    (parse_state->super_raw_parse_thread_state).m_bytes_actually_parsed = uVar7;
    (parse_state->super_raw_parse_thread_state).m_greedy_parse_gave_up = true;
  }
  return false;
}

Assistant:

bool lzcompressor::greedy_parse(parse_thread_state &parse_state)
   {
      parse_state.m_failed = true;
      parse_state.m_emit_decisions_backwards = false;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_ofs = 0;

      state &approx_state = *parse_state.m_pState;

      lzham::vector<lzpriced_decision> &decisions = parse_state.m_temp_decisions;

      if (!decisions.try_reserve(384))
      {
         LZHAM_LOG_ERROR(7042);
         return false;
      }

      if (!parse_state.m_best_decisions.try_resize(0))
      {
         LZHAM_LOG_ERROR(7043);
         return false;
      }

      while (cur_ofs < bytes_to_parse)
      {
         const uint max_admissable_match_len = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxHugeMatchLen), bytes_to_parse - cur_ofs);

         int largest_dec_index = enumerate_lz_decisions(cur_dict_ofs, approx_state, decisions, 1, max_admissable_match_len);
         if (largest_dec_index < 0)
         {
            LZHAM_LOG_ERROR(7044);
            return false;
         }

         const lzpriced_decision &dec = decisions[largest_dec_index];

         if (!parse_state.m_best_decisions.try_push_back(dec))
         {
            LZHAM_LOG_ERROR(7045);
            return false;
         }

         approx_state.partial_advance(dec);

         uint match_len = dec.get_len();
         LZHAM_ASSERT(match_len <= max_admissable_match_len);
         cur_dict_ofs += match_len;
         cur_lookahead_ofs += match_len;
         cur_ofs += match_len;

         if (parse_state.m_best_decisions.size() >= parse_state.m_max_greedy_decisions)
         {
            parse_state.m_greedy_parse_total_bytes_coded = cur_ofs;
            parse_state.m_bytes_actually_parsed = cur_ofs;
            parse_state.m_greedy_parse_gave_up = true;
            return false;
         }
      }

      parse_state.m_greedy_parse_total_bytes_coded = cur_ofs;

      LZHAM_ASSERT(cur_ofs == bytes_to_parse);

      parse_state.m_failed = false;
      parse_state.m_bytes_actually_parsed = parse_state.m_bytes_to_match;

      return true;
   }